

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void shuffle(int *arr,wchar_t n)

{
  int iVar1;
  uint32_t uVar2;
  wchar_t k;
  wchar_t j;
  wchar_t i;
  wchar_t n_local;
  int *arr_local;
  
  for (k = L'\0'; k < n; k = k + L'\x01') {
    uVar2 = Rand_div(n - k);
    iVar1 = arr[uVar2 + k];
    arr[uVar2 + k] = arr[k];
    arr[k] = iVar1;
  }
  return;
}

Assistant:

void shuffle(int *arr, int n)
{
	int i, j, k;
	for (i = 0; i < n; i++) {
		j = randint0(n - i) + i;
		k = arr[j];
		arr[j] = arr[i];
		arr[i] = k;
	}
}